

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set.c
# Opt level: O3

int mpt_object_set(mpt_object *obj,char *prop,char *fmt,...)

{
  char in_AL;
  int iVar1;
  mpt_metatype *pmVar2;
  _func_int_mpt_object_ptr_char_ptr_mpt_convertable_ptr *UNRECOVERED_JUMPTABLE;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  mpt_object *local_f8;
  char *local_f0;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (fmt == (char *)0x0) {
    UNRECOVERED_JUMPTABLE = obj->_vptr->set_property;
    pmVar2 = (mpt_metatype *)0x0;
  }
  else {
    if (*fmt != '\0') {
      local_e8.reg_save_area = local_c8;
      local_e8.overflow_arg_area = &stack0x00000008;
      local_e8.gp_offset = 0x18;
      local_e8.fp_offset = 0x30;
      local_f8 = obj;
      local_f0 = prop;
      iVar1 = mpt_process_vararg(fmt,&local_e8,process_object_args,&local_f8);
      return iVar1;
    }
    UNRECOVERED_JUMPTABLE = obj->_vptr->set_property;
    pmVar2 = mpt_metatype_default();
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(obj,prop,(mpt_convertable *)pmVar2);
  return iVar1;
}

Assistant:

extern int mpt_object_set(MPT_INTERFACE(object) *obj, const char *prop, const char *fmt, ...)
{
	va_list va;
	int ret;
	
	if (!fmt) {
		return obj->_vptr->set_property(obj, prop, 0);
	}
	if (!fmt[0]) {
		return obj->_vptr->set_property(obj, prop, (MPT_INTERFACE(convertable) *) mpt_metatype_default());
	}
	va_start(va, fmt);
	ret = process_object_format(obj, prop, fmt, va);
	va_end(va);
	
	return ret;
}